

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::SDLGraphicsSystem::createWindow
          (SDLGraphicsSystem *this,string *title,uint width,uint height)

{
  runtime_error *this_00;
  __uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> local_50;
  
  if (this->isWindowCreated != true) {
    initializeSDLOrQuitAndThrowError(this);
    createSDLWindowOrQuitAndThrowError((UniquePtr<SDL_Window> *)&local_50,this,title,width,height);
    std::__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>::operator=
              ((__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)&this->window,
               (__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)&local_50);
    std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr
              ((unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)&local_50);
    createSDLWindowRendererOrQuitAndThrowError
              ((UniquePtr<SDL_Renderer> *)&local_50,this,&this->window);
    std::__uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>::operator=
              ((__uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> *)
               &this->renderer,&local_50);
    std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>::~unique_ptr
              ((unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> *)&local_50);
    this->isWindowCreated = true;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Window already created");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SDLGraphicsSystem::createWindow(
    const std::string& title, const unsigned width, const unsigned height)
{
    if (isWindowCreated)
        throw std::runtime_error {"Window already created"};

    initializeSDLOrQuitAndThrowError();
    window = createSDLWindowOrQuitAndThrowError(title, width, height);
    renderer = createSDLWindowRendererOrQuitAndThrowError(window);
    isWindowCreated = true;
}